

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::
DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doPrintDefinition(DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                    *this,ostream *os)

{
  long *plVar1;
  Expr<tcu::Vector<float,_3>_> *pEVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  pointer pSVar8;
  ulong uVar9;
  long lVar10;
  long *local_40;
  long local_38;
  long local_30 [2];
  undefined8 *puVar4;
  
  iVar3 = (*(this->
            super_Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            ).super_FuncBase._vptr_FuncBase[10])();
  puVar4 = (undefined8 *)CONCAT44(extraout_var,iVar3);
  initialize(this);
  pcVar5 = glu::getDataTypeName(TYPE_FLOAT_VEC3);
  iVar3 = (int)os;
  if (pcVar5 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
  (*(this->
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).super_FuncBase._vptr_FuncBase[2])(&local_40,this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  pcVar5 = glu::getDataTypeName(TYPE_FLOAT_VEC3);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)*puVar4,puVar4[1]);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  pcVar5 = glu::getDataTypeName(TYPE_FLOAT_VEC3);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)puVar4[4],puVar4[5]);
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n{\n",4);
  pSVar8 = (this->m_body).
           super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_body).
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar8) {
    lVar10 = 0;
    uVar9 = 0;
    do {
      plVar1 = *(long **)((long)&(pSVar8->
                                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>)
                                 .m_ptr + lVar10);
      (**(code **)(*plVar1 + 0x10))(plVar1,os);
      uVar9 = uVar9 + 1;
      pSVar8 = (this->m_body).
               super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x10;
    } while (uVar9 < (ulong)((long)(this->m_body).
                                   super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"return ",7);
  pEVar2 = (this->m_ret).super_ContainerExprPBase<tcu::Vector<float,_3>_>.
           super_ExprPBase<tcu::Vector<float,_3>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>.
           m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[2])(pEVar2,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,";\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"}\n",2);
  return;
}

Assistant:

void						doPrintDefinition	(ostream& os) const
	{
		const ParamNames&	paramNames	= this->getParamNames();

		initialize();

		os << dataTypeNameOf<Ret>() << " " << this->getName()
			<< "(";
		if (isTypeValid<Arg0>())
			os << dataTypeNameOf<Arg0>() << " " << paramNames.a;
		if (isTypeValid<Arg1>())
			os << ", " << dataTypeNameOf<Arg1>() << " " << paramNames.b;
		if (isTypeValid<Arg2>())
			os << ", " << dataTypeNameOf<Arg2>() << " " << paramNames.c;
		if (isTypeValid<Arg3>())
			os << ", " << dataTypeNameOf<Arg3>() << " " << paramNames.d;
		os << ")\n{\n";

		for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
			os << *m_body[ndx];
		os << "return " << *m_ret << ";\n";
		os << "}\n";
	}